

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O0

int __thiscall llvm::MCRegisterInfo::getSEHRegNum(MCRegisterInfo *this,MCRegister RegNum)

{
  bool bVar1;
  pointer pvVar2;
  const_iterator local_38;
  undefined1 local_28 [8];
  const_iterator I;
  MCRegisterInfo *this_local;
  MCRegister RegNum_local;
  
  I.End = (pointer)this;
  this_local._0_4_ = RegNum.Reg;
  _local_28 = DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
              ::find((DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
                      *)&this->L2SEHRegs,(const_arg_type_t<llvm::MCRegister>)&this_local);
  local_38 = DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
             ::end((DenseMapBase<llvm::DenseMap<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>,_llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>_>
                    *)&this->L2SEHRegs);
  bVar1 = DenseMapIterator<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>,_true>
          ::operator==((DenseMapIterator<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>,_true>
                        *)local_28,&local_38);
  if (bVar1) {
    this_local._4_4_ = MCRegister::operator_cast_to_unsigned_int((MCRegister *)&this_local);
  }
  else {
    pvVar2 = DenseMapIterator<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>,_true>
             ::operator->((DenseMapIterator<llvm::MCRegister,_int,_llvm::DenseMapInfo<llvm::MCRegister>,_llvm::detail::DenseMapPair<llvm::MCRegister,_int>,_true>
                           *)local_28);
    this_local._4_4_ = (pvVar2->super_pair<llvm::MCRegister,_int>).second;
  }
  return this_local._4_4_;
}

Assistant:

int MCRegisterInfo::getSEHRegNum(MCRegister RegNum) const {
  const DenseMap<MCRegister, int>::const_iterator I = L2SEHRegs.find(RegNum);
  if (I == L2SEHRegs.end()) return (int)RegNum;
  return I->second;
}